

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O0

fdb_status sb_sync_circular(fdb_kvs_handle *handle)

{
  fdb_status fVar1;
  fdb_status fs;
  uint64_t sb_revnum;
  err_log_callback *in_stack_000003b8;
  size_t in_stack_000003c0;
  filemgr *in_stack_000003c8;
  memory_order in_stack_ffffffffffffffec;
  atomic<unsigned_long> *in_stack_fffffffffffffff0;
  
  atomic_get_uint64_t(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  fVar1 = sb_write(in_stack_000003c8,in_stack_000003c0,in_stack_000003b8);
  return fVar1;
}

Assistant:

fdb_status sb_sync_circular(fdb_kvs_handle *handle)
{
    uint64_t sb_revnum;
    fdb_status fs;

    sb_revnum = atomic_get_uint64_t(&handle->file->sb->revnum);
    fs = sb_write(handle->file,
                  sb_revnum % handle->file->sb->config->num_sb,
                  &handle->log_callback);
    return fs;
}